

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O3

int bn_x2bn(BIGNUM **outp,char *in,decode_func decode,char_test_func want_char)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  BIGNUM *a;
  long lVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  
  if (in == (char *)0x0) {
LAB_001af668:
    iVar5 = 0;
  }
  else {
    bVar1 = *in;
    if (bVar1 == 0) {
      return (uint)bVar1;
    }
    if (bVar1 == 0x2d) {
      in = in + 1;
    }
    uVar2 = (uint)(bVar1 == 0x2d);
    iVar5 = 1;
    lVar4 = (ulong)uVar2 - 0x7fffffff;
    pcVar6 = in;
    do {
      iVar3 = (*want_char)((int)*pcVar6);
      iVar5 = iVar5 + -1;
      if (iVar3 == 0) break;
      pcVar6 = pcVar6 + 1;
      bVar7 = lVar4 != 0;
      lVar4 = lVar4 + 1;
    } while (bVar7);
    if (outp == (BIGNUM **)0x0) {
      return uVar2 - iVar5;
    }
    a = (BIGNUM *)*outp;
    if (a == (BIGNUM *)0x0) {
      a = BN_new();
      if (a == (BIGNUM *)0x0) goto LAB_001af668;
    }
    else {
      BN_zero((BIGNUM *)a);
    }
    iVar3 = (*decode)((BIGNUM *)a,in,-iVar5);
    if (iVar3 == 0) {
      iVar5 = 0;
      if (*outp == (BIGNUM *)0x0) {
        BN_free(a);
        iVar5 = 0;
      }
    }
    else {
      bn_set_minimal_width((BIGNUM *)a);
      iVar3 = BN_is_zero((BIGNUM *)a);
      if (iVar3 == 0) {
        a->neg = uVar2;
      }
      *outp = (BIGNUM *)a;
      iVar5 = uVar2 - iVar5;
    }
  }
  return iVar5;
}

Assistant:

static int bn_x2bn(BIGNUM **outp, const char *in, decode_func decode,
                   char_test_func want_char) {
  BIGNUM *ret = NULL;
  int neg = 0, i;
  int num;

  if (in == NULL || *in == 0) {
    return 0;
  }

  if (*in == '-') {
    neg = 1;
    in++;
  }

  for (i = 0; want_char((unsigned char)in[i]) && i + neg < INT_MAX; i++) {
  }

  num = i + neg;
  if (outp == NULL) {
    return num;
  }

  // in is the start of the hex digits, and it is 'i' long
  if (*outp == NULL) {
    ret = BN_new();
    if (ret == NULL) {
      return 0;
    }
  } else {
    ret = *outp;
    BN_zero(ret);
  }

  if (!decode(ret, in, i)) {
    goto err;
  }

  bn_set_minimal_width(ret);
  if (!BN_is_zero(ret)) {
    ret->neg = neg;
  }

  *outp = ret;
  return num;

err:
  if (*outp == NULL) {
    BN_free(ret);
  }

  return 0;
}